

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderFailIfExtraTestissue107::runTestCase(TestCharReaderFailIfExtraTestissue107 *this)

{
  uint uVar1;
  _Elt_pointer this_00;
  long in_RDI;
  bool ok;
  string errs;
  CharReader *reader;
  char doc [6];
  Value root;
  CharReaderBuilder b;
  Value *in_stack_00000538;
  Value *in_stack_fffffffffffffe98;
  Value *in_stack_fffffffffffffea0;
  uint line;
  CharReaderBuilder *this_01;
  undefined4 in_stack_fffffffffffffea8;
  ValueType in_stack_fffffffffffffeac;
  CharReaderBuilder *in_stack_fffffffffffffeb0;
  uint line_00;
  string *actual;
  char *in_stack_fffffffffffffeb8;
  string *expected;
  TestResult *this_02;
  CharReaderBuilder *in_stack_fffffffffffffed0;
  string local_118 [39];
  undefined1 local_f1 [40];
  byte local_c9;
  TestResult local_c8;
  
  Json::CharReaderBuilder::CharReaderBuilder(in_stack_fffffffffffffeb0);
  Json::Value::Value((Value *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  local_c8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node._0_2_ = 0x33;
  local_c8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last._4_4_ = 0x3a323a31;
  Json::Value::Value(in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  Json::Value::operator[]
            ((Value *)in_stack_fffffffffffffeb0,
             (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  line_00 = (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  Json::Value::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  line = (uint)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  Json::Value::~Value((Value *)in_stack_fffffffffffffed0);
  this_00 = (_Elt_pointer)Json::CharReaderBuilder::newCharReader(in_stack_fffffffffffffed0);
  this_02 = &local_c8;
  local_c8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = this_00;
  std::__cxx11::string::string((string *)this_02);
  uVar1 = (*((_func_int **)
            ((ValueHolder *)
            &(local_c8.failures_.
              super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur)->file_)->int_)[2])
                    (local_c8.failures_.
                     super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur,
                     (undefined1 *)
                     ((long)&local_c8.failures_.
                             super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_last + 4),
                     (undefined1 *)
                     ((long)&local_c8.failures_.
                             super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node + 1),
                     &local_c8.name_._M_string_length,this_02);
  local_c9 = (byte)uVar1 & 1;
  if ((uVar1 & 1) != 0) {
    JsonTest::TestResult::addFailure
              (this_02,in_stack_fffffffffffffeb8,line_00,
               (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  actual = *(string **)(in_RDI + 8);
  expected = (string *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_f1 + 1),
             "* Line 1, Column 2\n  Extra non-whitespace after JSON value.\n",(allocator *)expected)
  ;
  std::__cxx11::string::string(local_118,(string *)&local_c8);
  JsonTest::checkStringEqual
            (this_02,expected,actual,
             (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),line,
             (char *)in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  this_01 = *(CharReaderBuilder **)(in_RDI + 8);
  uVar1 = Json::Value::asInt(in_stack_00000538);
  JsonTest::checkEqual<int,int>
            (this_02,(int)((ulong)expected >> 0x20),(int)expected,(char *)actual,uVar1,
             (char *)this_01);
  if (local_c8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur != (_Elt_pointer)0x0) {
    (*((_func_int **)
      ((ValueHolder *)
      &(local_c8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur)->file_)->int_)[1])();
  }
  std::__cxx11::string::~string((string *)&local_c8);
  Json::Value::~Value((Value *)this_00);
  Json::CharReaderBuilder::~CharReaderBuilder(this_01);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, issue107) {
  // This is interpretted as an int value followed by a colon.
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "1:2:3";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT_STRING_EQUAL(
      "* Line 1, Column 2\n"
      "  Extra non-whitespace after JSON value.\n",
      errs);
  JSONTEST_ASSERT_EQUAL(1, root.asInt());
  delete reader;
}